

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O1

void oonf_rfc5444_remove_protocol(oonf_rfc5444_protocol *protocol)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(2,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x1e7,0,0,
             "Remove protocol %s (refcount was %d)",protocol,protocol->_refcount);
  }
  if (1 < protocol->_refcount) {
    protocol->_refcount = protocol->_refcount + -1;
    return;
  }
  plVar3 = (protocol->_interface_tree).list_head.next;
  plVar2 = plVar3->prev;
  while (plVar2 != (protocol->_interface_tree).list_head.prev) {
    plVar1 = plVar3->next;
    oonf_rfc5444_remove_interface
              ((oonf_rfc5444_interface *)&plVar3[-2].prev,(oonf_rfc5444_interface_listener *)0x0);
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  oonf_duplicate_set_remove(&protocol->forwarded_set);
  oonf_duplicate_set_remove(&protocol->processed_set);
  rfc5444_reader_cleanup(&protocol->reader);
  rfc5444_writer_cleanup(&protocol->writer);
  avl_remove(&_protocol_tree,&protocol->_node);
  oonf_class_free(&_protocol_memcookie,protocol);
  return;
}

Assistant:

void
oonf_rfc5444_remove_protocol(struct oonf_rfc5444_protocol *protocol) {
  struct oonf_rfc5444_interface *interf, *i_it;

  OONF_INFO(LOG_RFC5444, "Remove protocol %s (refcount was %d)", protocol->name, protocol->_refcount);

  if (protocol->_refcount > 1) {
    /* There are still users left for this protocol */
    protocol->_refcount--;
    return;
  }

  /* free all remaining interfaces */
  avl_for_each_element_safe(&protocol->_interface_tree, interf, _node, i_it) {
    oonf_rfc5444_remove_interface(interf, NULL);
  }

  /* free processing/forwarding set */
  oonf_duplicate_set_remove(&protocol->forwarded_set);
  oonf_duplicate_set_remove(&protocol->processed_set);

  /* free reader, writer and protocol itself */
  rfc5444_reader_cleanup(&protocol->reader);
  rfc5444_writer_cleanup(&protocol->writer);

  avl_remove(&_protocol_tree, &protocol->_node);
  oonf_class_free(&_protocol_memcookie, protocol);
}